

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::InternalDeallocate
          (RepeatedField<unsigned_long> *this,Rep *rep,int size)

{
  unsigned_long *e;
  int size_local;
  Rep *rep_local;
  RepeatedField<unsigned_long> *this_local;
  
  if ((rep != (Rep *)0x0) && (rep->arena == (Arena *)0x0)) {
    operator_delete(rep);
  }
  return;
}

Assistant:

void InternalDeallocate(Rep* rep, int size) {
    if (rep != nullptr) {
      Element* e = &rep->elements[0];
      if (!std::is_trivial<Element>::value) {
        Element* limit = &rep->elements[size];
        for (; e < limit; e++) {
          e->~Element();
        }
      }
      if (rep->arena == nullptr) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
        const size_t bytes = size * sizeof(*e) + kRepHeaderSize;
        ::operator delete(static_cast<void*>(rep), bytes);
#else
        ::operator delete(static_cast<void*>(rep));
#endif
      }
    }
  }